

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileExporter.cpp
# Opt level: O1

void __thiscall Assimp::XFileExporter::WriteFrameTransform(XFileExporter *this,aiMatrix4x4 *m)

{
  undefined1 *puVar1;
  ostream *poVar2;
  
  puVar1 = &this->field_0x18;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"FrameTransformMatrix {",0x16);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  std::__cxx11::string::append((char *)&this->startstr);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,(this->startstr)._M_string_length);
  poVar2 = std::ostream::_M_insert<double>((double)m->a1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)m->b1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)m->c1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)m->d1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,(this->startstr)._M_string_length);
  poVar2 = std::ostream::_M_insert<double>((double)m->a2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)m->b2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)m->c2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)m->d2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,(this->startstr)._M_string_length);
  poVar2 = std::ostream::_M_insert<double>((double)m->a3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)m->b3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)m->c3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)m->d3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,(this->startstr)._M_string_length);
  poVar2 = std::ostream::_M_insert<double>((double)m->a4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)m->b4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)m->c4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)m->d4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,";;",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  PopTag(this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  return;
}

Assistant:

void XFileExporter::WriteFrameTransform(aiMatrix4x4& m)
{
    mOutput << startstr << "FrameTransformMatrix {" << endstr << " ";
    PushTag();
    mOutput << startstr << m.a1 << ", " << m.b1 << ", " << m.c1 << ", " << m.d1 << "," << endstr;
    mOutput << startstr << m.a2 << ", " << m.b2 << ", " << m.c2 << ", " << m.d2 << "," << endstr;
    mOutput << startstr << m.a3 << ", " << m.b3 << ", " << m.c3 << ", " << m.d3 << "," << endstr;
    mOutput << startstr << m.a4 << ", " << m.b4 << ", " << m.c4 << ", " << m.d4 << ";;" << endstr;
    PopTag();
    mOutput << startstr << "}" << endstr << endstr;
}